

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::bin_writer<3>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,int num_digits,string_view prefix,
          format_specs specs,bin_writer<3> f)

{
  type tVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  char cVar5;
  int value;
  ulong uVar6;
  format_specs local_70;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<char,_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
  local_60;
  
  local_70._8_8_ = specs._8_8_;
  local_70._0_8_ = specs._0_8_;
  sVar3 = prefix.size_;
  tVar1 = to_unsigned<int>(num_digits);
  uVar6 = tVar1 + sVar3;
  cVar5 = specs.fill.data_[0];
  if ((specs._9_1_ & 0xf) == 4) {
    tVar1 = to_unsigned<int>(specs.width);
    uVar4 = (ulong)tVar1;
    local_60.padding = 0;
    local_60.size_ = uVar6;
    if (uVar6 <= uVar4) {
      local_60.padding = uVar4 - uVar6;
      local_60.size_ = uVar4;
    }
  }
  else {
    value = specs.precision;
    if (value - num_digits == 0 || value < num_digits) {
      uVar2 = 0;
    }
    else {
      tVar1 = to_unsigned<int>(value);
      uVar6 = tVar1 + sVar3;
      uVar2 = to_unsigned<int>(value - num_digits);
      cVar5 = '0';
    }
    local_60.padding = (ulong)uVar2;
    local_60.size_ = uVar6;
    if (((undefined1  [16])specs & (undefined1  [16])0xf00) == (undefined1  [16])0x0) {
      local_70._8_8_ = CONCAT62(local_70._10_6_,CONCAT11(specs._9_1_,local_70.type)) | 0x200;
    }
  }
  local_60.f = f;
  local_60.prefix.data_ = prefix.data_;
  local_60.prefix.size_ = sVar3;
  local_60.fill = cVar5;
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::bin_writer<3>>>
            (this,&local_70,&local_60);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }